

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>
                   (string *__return_storage_ptr__,char (*a) [50],int *b,char (*args) [8],
                   int *args_1,char (*args_2) [8],int *args_3)

{
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_168 [56];
  undefined1 local_130 [56];
  undefined1 local_f8 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  size_t local_a8;
  string *local_a0;
  cmAlphaNum *local_98;
  size_t local_90;
  char (*local_88) [8];
  undefined8 local_80;
  size_t local_78;
  string *local_70;
  cmAlphaNum *local_68;
  size_t local_60;
  char (*local_58) [8];
  undefined8 local_50;
  size_t local_48;
  string *local_40;
  cmAlphaNum *local_38;
  
  local_c0.first._M_len = strlen(*a);
  local_c0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c0.first._M_str = *a;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_f8,*b);
  pcVar1 = (cmAlphaNum *)(local_f8 + 0x10);
  if ((cmAlphaNum *)local_f8._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_f8._0_8_;
  }
  local_a0 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_f8;
  if ((cmAlphaNum *)local_f8._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_f8._0_8_;
  }
  local_a8 = (pcVar1->View_)._M_len;
  local_98 = (cmAlphaNum *)local_f8._0_8_;
  local_90 = strlen(*args);
  local_80 = 0;
  local_88 = args;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_130,*args_1);
  pcVar1 = (cmAlphaNum *)(local_130 + 0x10);
  if ((cmAlphaNum *)local_130._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_130._0_8_;
  }
  local_70 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_130;
  if ((cmAlphaNum *)local_130._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_130._0_8_;
  }
  local_78 = (pcVar1->View_)._M_len;
  local_68 = (cmAlphaNum *)local_130._0_8_;
  local_60 = strlen(*args_2);
  local_50 = 0;
  local_58 = args_2;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_168,*args_3);
  pcVar1 = (cmAlphaNum *)(local_168 + 0x10);
  if ((cmAlphaNum *)local_168._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_168._0_8_;
  }
  local_40 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_168;
  if ((cmAlphaNum *)local_168._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_168._0_8_;
  }
  local_48 = (pcVar1->View_)._M_len;
  local_38 = (cmAlphaNum *)local_168._0_8_;
  views._M_len = 6;
  views._M_array = &local_c0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}